

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

int fileIn_version_1(FILE *fp)

{
  object *poVar1;
  int local_14;
  int i;
  FILE *fp_local;
  
  if (inSpaceOne == 0) {
    indirArray = (object **)spaceOne;
  }
  else {
    indirArray = (object **)spaceTwo;
  }
  indirtop = 0;
  fprintf(_stderr,"reading globals object.\n");
  globalsObject = objectRead(fp);
  addStaticRoot(&globalsObject);
  fprintf(_stderr,"reading initial method.\n");
  initialMethod = objectRead(fp);
  addStaticRoot(&initialMethod);
  fprintf(_stderr,"reading binary message objects.\n");
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    poVar1 = objectRead(fp);
    binaryMessages[local_14] = poVar1;
    addStaticRoot(binaryMessages + local_14);
  }
  fprintf(_stderr,"reading bad method symbol.\n");
  badMethodSym = objectRead(fp);
  addStaticRoot(&badMethodSym);
  nilObject = lookupGlobal("nil");
  addStaticRoot(&nilObject);
  trueObject = lookupGlobal("true");
  addStaticRoot(&trueObject);
  falseObject = lookupGlobal("false");
  addStaticRoot(&falseObject);
  ArrayClass = lookupGlobal("Array");
  addStaticRoot(&ArrayClass);
  BlockClass = lookupGlobal("Block");
  addStaticRoot(&BlockClass);
  ByteArrayClass = lookupGlobal("ByteArray");
  addStaticRoot(&ByteArrayClass);
  ContextClass = lookupGlobal("Context");
  addStaticRoot(&ContextClass);
  DictionaryClass = lookupGlobal("Dictionary");
  addStaticRoot(&DictionaryClass);
  IntegerClass = lookupGlobal("Integer");
  addStaticRoot(&IntegerClass);
  SmallIntClass = lookupGlobal("SmallInt");
  addStaticRoot(&SmallIntClass);
  StringClass = lookupGlobal("String");
  addStaticRoot(&StringClass);
  SymbolClass = lookupGlobal("Symbol");
  addStaticRoot(&SymbolClass);
  UndefinedClass = lookupGlobal("Undefined");
  addStaticRoot(&UndefinedClass);
  memset(indirArray,0,(long)spaceSize << 4);
  fprintf(_stderr,"Read in %d objects.\n",(ulong)(uint)indirtop);
  return indirtop;
}

Assistant:

int fileIn_version_1(FILE *fp)
{
    int i;

    /* use the currently unused space for the indir pointers */
    if (inSpaceOne) {
        indirArray = (struct object * *) spaceTwo;
    } else {
        indirArray = (struct object * *) spaceOne;
    }
    indirtop = 0;

    /* read the base objects from the image file. */

    fprintf(stderr, "reading globals object.\n");
    globalsObject = objectRead(fp);
    addStaticRoot(&globalsObject);

    fprintf(stderr, "reading initial method.\n");
    initialMethod = objectRead(fp);
    addStaticRoot(&initialMethod);

    fprintf(stderr, "reading binary message objects.\n");
    for (i = 0; i < 3; i++) {
        binaryMessages[i] = objectRead(fp);
        addStaticRoot(&binaryMessages[i]);
    }

    fprintf(stderr, "reading bad method symbol.\n");
    badMethodSym = objectRead(fp);
    addStaticRoot(&badMethodSym);

    /* fix up everything from globals. */
    nilObject = lookupGlobal("nil");
    addStaticRoot(&nilObject);

    trueObject = lookupGlobal("true");
    addStaticRoot(&trueObject);

    falseObject = lookupGlobal("false");
    addStaticRoot(&falseObject);

    ArrayClass = lookupGlobal("Array");
    addStaticRoot(&ArrayClass);

    BlockClass = lookupGlobal("Block");
    addStaticRoot(&BlockClass);

    ByteArrayClass = lookupGlobal("ByteArray");
    addStaticRoot(&ByteArrayClass);

    ContextClass = lookupGlobal("Context");
    addStaticRoot(&ContextClass);

    DictionaryClass = lookupGlobal("Dictionary");
    addStaticRoot(&DictionaryClass);

    IntegerClass = lookupGlobal("Integer");
    addStaticRoot(&IntegerClass);

    SmallIntClass = lookupGlobal("SmallInt");
    addStaticRoot(&SmallIntClass);

    StringClass = lookupGlobal("String");
    addStaticRoot(&StringClass);

    SymbolClass = lookupGlobal("Symbol");
    addStaticRoot(&SymbolClass);

    UndefinedClass = lookupGlobal("Undefined");
    addStaticRoot(&UndefinedClass);

    /* clean up after ourselves. */
    memset((void *) indirArray,(int)0,(size_t)((size_t)spaceSize * sizeof(struct object)));

    fprintf(stderr, "Read in %d objects.\n", indirtop);

    return indirtop;
}